

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O0

void M_StartupSkillMenu(FGameStartup *gs)

{
  char cVar1;
  int height;
  EColorRange color2;
  FMenuDescriptor *pFVar2;
  FFont *font;
  FOptionMenuItem *pFVar3;
  EColorRange color_00;
  FName FVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  FListMenuItem **ppFVar10;
  FSkillInfo *this;
  FEpisode *pFVar11;
  size_t sVar12;
  char *pcVar13;
  FListMenuItemText *pFVar14;
  FOptionMenuDescriptor *pFVar15;
  FMenuDescriptor **ppFVar16;
  FOptionMenuItem **ppFVar17;
  FOptionMenuItemSubmenu *this_00;
  ENamedName index;
  int *local_1e0;
  byte local_1c5;
  FString *local_178;
  byte local_135;
  FName local_104;
  int *local_100;
  FString *pItemText_1;
  char *action_1;
  FOptionMenuItem *li_1;
  FSkillInfo *skill_1;
  uint local_d8;
  uint i_5;
  uint i_4;
  FOptionMenuDescriptor *od;
  EColorRange local_c0;
  EColorRange color;
  FName local_b0;
  FTextureID local_ac;
  int local_a8;
  FName local_a4;
  FTextureID tex;
  FString *pItemText;
  FListMenuItemText *pFStack_90;
  FName action;
  FListMenuItem *li;
  FSkillInfo *skill;
  uint i_3;
  uint firstitem;
  uint i_2;
  int topdelta;
  int newtop;
  int totalheight;
  int y_1;
  uint i_1;
  int topy;
  int posy;
  int defskill;
  uint j;
  FName n;
  uint i;
  int y;
  int x;
  FListMenuDescriptor *ld;
  FMenuDescriptor **local_30;
  FMenuDescriptor **desc;
  FGameStartup *pFStack_20;
  bool success;
  FGameStartup *gs_local;
  
  desc._7_1_ = 0;
  pFStack_20 = gs;
  FName::FName((FName *)((long)&ld + 4),NAME_Skillmenu);
  local_30 = TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>::
             CheckKey(&MenuDescriptors,(FName *)((long)&ld + 4));
  if ((local_30 == (FMenuDescriptor **)0x0) || ((*local_30)->mType != 0)) {
LAB_003e518d:
    if ((desc._7_1_ & 1) == 0) {
LAB_003e519a:
      if (local_30 == (FMenuDescriptor **)0x0) {
        pFVar15 = (FOptionMenuDescriptor *)operator_new(0x60);
        FOptionMenuDescriptor::FOptionMenuDescriptor(pFVar15);
        _i_4 = pFVar15;
        if ((local_30 != (FMenuDescriptor **)0x0) && (*local_30 != (FMenuDescriptor *)0x0)) {
          (*(*local_30)->_vptr_FMenuDescriptor[1])();
        }
        pFVar15 = _i_4;
        FName::FName((FName *)&i_5,NAME_Skillmenu);
        ppFVar16 = TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>
                   ::operator[](&MenuDescriptors,(FName *)&i_5);
        *ppFVar16 = &pFVar15->super_FMenuDescriptor;
        (_i_4->super_FMenuDescriptor).mType = 1;
        FName::operator=(&(_i_4->super_FMenuDescriptor).mMenuName,NAME_Skillmenu);
        FString::operator=(&_i_4->mTitle,"$MNU_CHOOSESKILL");
        _i_4->mSelectedItem = 0;
        _i_4->mScrollPos = 0;
        (_i_4->super_FMenuDescriptor).mClass = (PClass *)0x0;
        _i_4->mPosition = -0xf;
        _i_4->mScrollTop = 0;
        _i_4->mIndent = 0xa0;
        _i_4->mDontDim = false;
      }
      else {
        _i_4 = (FOptionMenuDescriptor *)*local_30;
        for (local_d8 = 0; uVar7 = local_d8,
            uVar6 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Size
                              (&(_i_4->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>),
            uVar7 < uVar6; local_d8 = local_d8 + 1) {
          ppFVar17 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::operator[]
                               (&(_i_4->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,
                                (ulong)local_d8);
          if (*ppFVar17 != (FOptionMenuItem *)0x0) {
            (*((*ppFVar17)->super_FListMenuItem)._vptr_FListMenuItem[1])();
          }
        }
        TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Clear
                  (&(_i_4->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>);
      }
      for (skill_1._4_4_ = 0; uVar7 = skill_1._4_4_,
          uVar6 = TArray<FSkillInfo,_FSkillInfo>::Size(&AllSkills), uVar7 < uVar6;
          skill_1._4_4_ = skill_1._4_4_ + 1) {
        li_1 = (FOptionMenuItem *)
               TArray<FSkillInfo,_FSkillInfo>::operator[](&AllSkills,(ulong)skill_1._4_4_);
        local_1c5 = 0;
        if ((((FSkillInfo *)li_1)->MustConfirm & 1U) != 0) {
          pFVar11 = TArray<FEpisode,_FEpisode>::operator[](&AllEpisodes,(long)pFStack_20->Episode);
          local_1c5 = pFVar11->mNoSkill ^ 0xff;
        }
        pcVar13 = "Startgame";
        if ((local_1c5 & 1) != 0) {
          pcVar13 = "StartgameConfirm";
        }
        local_100 = (int *)0x0;
        pItemText_1 = (FString *)pcVar13;
        if (pFStack_20->PlayerClass != (char *)0x0) {
          pFVar3 = li_1 + 2;
          FName::FName(&local_104,pFStack_20->PlayerClass);
          local_100 = (int *)TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_>::
                             CheckKey((TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_>
                                       *)&pFVar3->mLabel,&local_104);
        }
        this_00 = (FOptionMenuItemSubmenu *)operator_new(0x28);
        if (local_100 == (int *)0x0) {
          local_1e0 = &li_1[2].super_FListMenuItem.mXpos;
        }
        else {
          local_1e0 = local_100;
        }
        pcVar13 = FString::operator_cast_to_char_((FString *)local_1e0);
        FOptionMenuItemSubmenu::FOptionMenuItemSubmenu
                  (this_00,pcVar13,(char *)pItemText_1,skill_1._4_4_);
        action_1 = (char *)this_00;
        TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                  (&(_i_4->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,
                   (FOptionMenuItem **)&action_1);
        if (M_StartupSkillMenu::done == 0) {
          M_StartupSkillMenu::done = 1;
          iVar9 = M_GetDefaultSkill();
          _i_4->mSelectedItem = iVar9;
        }
      }
    }
    return;
  }
  pFVar2 = *local_30;
  iVar9 = *(int *)((long)&pFVar2[1].mClass + 4);
  n.Index = *(int *)&pFVar2[2]._vptr_FMenuDescriptor;
  j = 0;
LAB_003e4a8a:
  uVar7 = j;
  uVar6 = TArray<FListMenuItem_*,_FListMenuItem_*>::Size
                    ((TArray<FListMenuItem_*,_FListMenuItem_*> *)(pFVar2 + 1));
  if (uVar7 < uVar6) {
    ppFVar10 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                         ((TArray<FListMenuItem_*,_FListMenuItem_*> *)(pFVar2 + 1),(ulong)j);
    (*(*ppFVar10)->_vptr_FListMenuItem[7])(&defskill,*ppFVar10,0);
    bVar5 = FName::operator==((FName *)&defskill,NAME_Startgame);
    if ((!bVar5) && (bVar5 = FName::operator==((FName *)&defskill,NAME_StartgameConfirm), !bVar5))
    goto LAB_003e4b71;
    for (posy = j;
        uVar7 = TArray<FListMenuItem_*,_FListMenuItem_*>::Size
                          ((TArray<FListMenuItem_*,_FListMenuItem_*> *)(pFVar2 + 1)),
        (uint)posy < uVar7; posy = posy + 1) {
      ppFVar10 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                           ((TArray<FListMenuItem_*,_FListMenuItem_*> *)(pFVar2 + 1),
                            (ulong)(uint)posy);
      if (*ppFVar10 != (FListMenuItem *)0x0) {
        (*(*ppFVar10)->_vptr_FListMenuItem[1])();
      }
    }
    TArray<FListMenuItem_*,_FListMenuItem_*>::Resize
              ((TArray<FListMenuItem_*,_FListMenuItem_*> *)(pFVar2 + 1),j);
  }
  iVar8 = DefaultSkill;
  if (M_StartupSkillMenu::done == restart) {
LAB_003e4d74:
    uVar7 = TArray<FListMenuItem_*,_FListMenuItem_*>::Size
                      ((TArray<FListMenuItem_*,_FListMenuItem_*> *)(pFVar2 + 1));
    for (skill._0_4_ = 0; uVar6 = TArray<FSkillInfo,_FSkillInfo>::Size(&AllSkills),
        (uint)skill < uVar6; skill._0_4_ = (uint)skill + 1) {
      this = TArray<FSkillInfo,_FSkillInfo>::operator[](&AllSkills,(ulong)(uint)skill);
      local_135 = 0;
      if ((this->MustConfirm & 1U) != 0) {
        pFVar11 = TArray<FEpisode,_FEpisode>::operator[](&AllEpisodes,(long)pFStack_20->Episode);
        local_135 = pFVar11->mNoSkill ^ 0xff;
      }
      index = NAME_Startgame;
      if ((local_135 & 1) != 0) {
        index = NAME_StartgameConfirm;
      }
      FName::FName((FName *)((long)&pItemText + 4),index);
      _tex = (FString *)0x0;
      if (pFStack_20->PlayerClass != (char *)0x0) {
        FName::FName(&local_a4,pFStack_20->PlayerClass);
        _tex = TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_>::CheckKey
                         (&this->MenuNamesForPlayerClass,&local_a4);
      }
      sVar12 = FString::Len(&this->PicName);
      if ((sVar12 == 0) || (_tex != (FString *)0x0)) {
        local_c0 = FSkillInfo::GetTextColor(this);
        if (local_c0 == CR_UNTRANSLATED) {
          local_c0 = *(EColorRange *)&pFVar2[2].mClass;
        }
        pFVar14 = (FListMenuItemText *)operator_new(0x40);
        FVar4 = n;
        iVar8 = *(int *)&pFVar2[2].field_0xc;
        cVar1 = this->Shortcut;
        if (_tex == (FString *)0x0) {
          local_178 = &this->MenuName;
        }
        else {
          local_178 = _tex;
        }
        pcVar13 = FString::operator_cast_to_char_(local_178);
        color_00 = local_c0;
        font = *(FFont **)&pFVar2[2].mType;
        color2 = *(EColorRange *)((long)&pFVar2[2].mClass + 4);
        FName::FName((FName *)((long)&od + 4),(FName *)((long)&pItemText + 4));
        FListMenuItemText::FListMenuItemText
                  (pFVar14,iVar9,FVar4.Index,iVar8,(int)cVar1,pcVar13,font,color_00,color2,
                   (FName *)((long)&od + 4),(uint)skill);
        pFStack_90 = pFVar14;
      }
      else {
        pcVar13 = FString::operator_cast_to_char_(&this->PicName);
        local_a8 = (int)GetMenuTexture(pcVar13);
        pFVar14 = (FListMenuItemText *)operator_new(0x28);
        FVar4 = n;
        iVar8 = *(int *)((long)&pFVar2[1].mClass + 4);
        height = *(int *)&pFVar2[2].field_0xc;
        cVar1 = this->Shortcut;
        local_ac.texnum = local_a8;
        FName::FName(&local_b0,(FName *)((long)&pItemText + 4));
        FListMenuItemPatch::FListMenuItemPatch
                  ((FListMenuItemPatch *)pFVar14,iVar8,FVar4.Index,height,(int)cVar1,local_ac,
                   &local_b0,(uint)skill);
        pFStack_90 = pFVar14;
      }
      TArray<FListMenuItem_*,_FListMenuItem_*>::Push
                ((TArray<FListMenuItem_*,_FListMenuItem_*> *)(pFVar2 + 1),
                 (FListMenuItem **)&stack0xffffffffffffff70);
      n.Index = *(int *)&pFVar2[2].field_0xc + n.Index;
    }
    pFVar11 = TArray<FEpisode,_FEpisode>::operator[](&AllEpisodes,(long)pFStack_20->Episode);
    if (((pFVar11->mNoSkill & 1U) == 0) &&
       (uVar6 = TArray<FSkillInfo,_FSkillInfo>::Size(&AllSkills), uVar6 != 1)) {
      *(undefined4 *)&pFVar2[2].mNetgameMessage.Chars = 0xffffffff;
    }
    else {
      iVar9 = M_GetDefaultSkill();
      *(uint *)&pFVar2[2].mNetgameMessage.Chars = uVar7 + iVar9;
    }
    desc._7_1_ = 1;
    goto LAB_003e518d;
  }
  M_StartupSkillMenu::done = restart;
  topy = DefaultSkill;
  uVar7 = TArray<FSkillInfo,_FSkillInfo>::Size(&AllSkills);
  if (uVar7 <= (uint)iVar8) {
    uVar7 = TArray<FSkillInfo,_FSkillInfo>::Size(&AllSkills);
    topy = uVar7 - 1 >> 1;
  }
  uVar7 = TArray<FListMenuItem_*,_FListMenuItem_*>::Size
                    ((TArray<FListMenuItem_*,_FListMenuItem_*> *)(pFVar2 + 1));
  FVar4 = n;
  *(uint *)&pFVar2[1].mNetgameMessage.Chars = uVar7 + topy;
  y_1 = n.Index;
  for (totalheight = 0;
      uVar7 = TArray<FListMenuItem_*,_FListMenuItem_*>::Size
                        ((TArray<FListMenuItem_*,_FListMenuItem_*> *)(pFVar2 + 1)),
      (uint)totalheight < uVar7; totalheight = totalheight + 1) {
    ppFVar10 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                         ((TArray<FListMenuItem_*,_FListMenuItem_*> *)(pFVar2 + 1),
                          (ulong)(uint)totalheight);
    iVar8 = FListMenuItem::GetY(*ppFVar10);
    if (iVar8 < y_1) {
      y_1 = iVar8;
    }
  }
  uVar7 = TArray<FSkillInfo,_FSkillInfo>::Size(&AllSkills);
  iVar8 = (FVar4.Index + uVar7 * *(int *)&pFVar2[2].field_0xc) - y_1;
  if ((iVar8 < 0xbe) || (uVar7 = TArray<FSkillInfo,_FSkillInfo>::Size(&AllSkills), uVar7 == 1)) {
    iVar8 = ((200 - iVar8) + y_1) / 2 - y_1;
    if (iVar8 < 0) {
      for (i_3 = 0; uVar7 = TArray<FListMenuItem_*,_FListMenuItem_*>::Size
                                      ((TArray<FListMenuItem_*,_FListMenuItem_*> *)(pFVar2 + 1)),
          i_3 < uVar7; i_3 = i_3 + 1) {
        ppFVar10 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                             ((TArray<FListMenuItem_*,_FListMenuItem_*> *)(pFVar2 + 1),(ulong)i_3);
        FListMenuItem::OffsetPositionY(*ppFVar10,iVar8);
      }
      n.Index = FVar4.Index - iVar8;
      *(int *)&pFVar2[2]._vptr_FMenuDescriptor = n.Index;
    }
    goto LAB_003e4d74;
  }
  if (pFVar2 != (FMenuDescriptor *)0x0) {
    (*pFVar2->_vptr_FMenuDescriptor[1])();
  }
  local_30 = (FMenuDescriptor **)0x0;
  M_StartupSkillMenu::done = 0;
  goto LAB_003e519a;
LAB_003e4b71:
  j = j + 1;
  goto LAB_003e4a8a;
}

Assistant:

void M_StartupSkillMenu(FGameStartup *gs)
{
	static int done = -1;
	bool success = false;
	FMenuDescriptor **desc = MenuDescriptors.CheckKey(NAME_Skillmenu);
	if (desc != NULL)
	{
		if ((*desc)->mType == MDESC_ListMenu)
		{
			FListMenuDescriptor *ld = static_cast<FListMenuDescriptor*>(*desc);
			int x = ld->mXpos;
			int y = ld->mYpos;

			// Delete previous contents
			for(unsigned i=0; i<ld->mItems.Size(); i++)
			{
				FName n = ld->mItems[i]->GetAction(NULL);
				if (n == NAME_Startgame || n == NAME_StartgameConfirm) 
				{
					for(unsigned j=i; j<ld->mItems.Size(); j++)
					{
						delete ld->mItems[j];
					}
					ld->mItems.Resize(i);
					break;
				}
			}

			if (done != restart)
			{
				done = restart;
				int defskill = DefaultSkill;
				if ((unsigned int)defskill >= AllSkills.Size())
				{
					defskill = (AllSkills.Size() - 1) / 2;
				}
				ld->mSelectedItem = ld->mItems.Size() + defskill;

				int posy = y;
				int topy = posy;

				// Get lowest y coordinate of any static item in the menu
				for(unsigned i = 0; i < ld->mItems.Size(); i++)
				{
					int y = ld->mItems[i]->GetY();
					if (y < topy) topy = y;
				}

				// center the menu on the screen if the top space is larger than the bottom space
				int totalheight = posy + AllSkills.Size() * ld->mLinespacing - topy;

				if (totalheight < 190 || AllSkills.Size() == 1)
				{
					int newtop = (200 - totalheight + topy) / 2;
					int topdelta = newtop - topy;
					if (topdelta < 0)
					{
						for(unsigned i = 0; i < ld->mItems.Size(); i++)
						{
							ld->mItems[i]->OffsetPositionY(topdelta);
						}
						y = ld->mYpos = posy - topdelta;
					}
				}
				else
				{
					// too large
					delete ld;
					desc = NULL;
					done = false;
					goto fail;
				}
			}

			unsigned firstitem = ld->mItems.Size();
			for(unsigned int i = 0; i < AllSkills.Size(); i++)
			{
				FSkillInfo &skill = AllSkills[i];
				FListMenuItem *li;
				// Using a different name for skills that must be confirmed makes handling this easier.
				FName action = (skill.MustConfirm && !AllEpisodes[gs->Episode].mNoSkill) ?
					NAME_StartgameConfirm : NAME_Startgame;
				FString *pItemText = NULL;
				if (gs->PlayerClass != NULL)
				{
					pItemText = skill.MenuNamesForPlayerClass.CheckKey(gs->PlayerClass);
				}

				if (skill.PicName.Len() != 0 && pItemText == NULL)
				{
					FTextureID tex = GetMenuTexture(skill.PicName);
					li = new FListMenuItemPatch(ld->mXpos, y, ld->mLinespacing, skill.Shortcut, tex, action, i);
				}
				else
				{
					EColorRange color = (EColorRange)skill.GetTextColor();
					if (color == CR_UNTRANSLATED) color = ld->mFontColor;
					li = new FListMenuItemText(x, y, ld->mLinespacing, skill.Shortcut, 
									pItemText? *pItemText : skill.MenuName, ld->mFont, color,ld->mFontColor2, action, i);
				}
				ld->mItems.Push(li);
				y += ld->mLinespacing;
			}
			if (AllEpisodes[gs->Episode].mNoSkill || AllSkills.Size() == 1)
			{
				ld->mAutoselect = firstitem + M_GetDefaultSkill();
			}
			else
			{
				ld->mAutoselect = -1;
			}
			success = true;
		}
	}
	if (success) return;
fail:
	// Option menu fallback for overlong skill lists
	FOptionMenuDescriptor *od;
	if (desc == NULL)
	{
		od = new FOptionMenuDescriptor;
		if (desc != NULL) delete *desc;
		MenuDescriptors[NAME_Skillmenu] = od;
		od->mType = MDESC_OptionsMenu;
		od->mMenuName = NAME_Skillmenu;
		od->mTitle = "$MNU_CHOOSESKILL";
		od->mSelectedItem = 0;
		od->mScrollPos = 0;
		od->mClass = NULL;
		od->mPosition = -15;
		od->mScrollTop = 0;
		od->mIndent = 160;
		od->mDontDim = false;
	}
	else
	{
		od = static_cast<FOptionMenuDescriptor*>(*desc);
		for(unsigned i=0;i<od->mItems.Size(); i++)
		{
			delete od->mItems[i];
		}
		od->mItems.Clear();
	}
	for(unsigned int i = 0; i < AllSkills.Size(); i++)
	{
		FSkillInfo &skill = AllSkills[i];
		FOptionMenuItem *li;
		// Using a different name for skills that must be confirmed makes handling this easier.
		const char *action = (skill.MustConfirm && !AllEpisodes[gs->Episode].mNoSkill) ?
			"StartgameConfirm" : "Startgame";

		FString *pItemText = NULL;
		if (gs->PlayerClass != NULL)
		{
			pItemText = skill.MenuNamesForPlayerClass.CheckKey(gs->PlayerClass);
		}
		li = new FOptionMenuItemSubmenu(pItemText? *pItemText : skill.MenuName, action, i);
		od->mItems.Push(li);
		if (!done)
		{
			done = true;
			od->mSelectedItem = M_GetDefaultSkill();
		}
	}
}